

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O0

_Bool progress_meter(GlobalConfig *global,timeval *start,_Bool final)

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  curl_off_t cVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  timeval newer;
  timeval older;
  long local_138;
  curl_off_t left;
  curl_off_t est;
  curl_off_t uls;
  curl_off_t dls;
  curl_off_t ul;
  curl_off_t dl;
  long deltams;
  uint i;
  curl_off_t speed;
  curl_off_t all_queued;
  curl_off_t all_running;
  _Bool ulknown;
  curl_off_t cStack_d0;
  _Bool dlknown;
  curl_off_t all_ulnow;
  curl_off_t all_dlnow;
  per_transfer *per;
  char ulpercen [4];
  char dlpercen [4];
  curl_off_t spent;
  char buffer [3] [6];
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  __suseconds_t local_70;
  long diff;
  timeval now;
  _Bool final_local;
  timeval *start_local;
  GlobalConfig *global_local;
  
  if ((global->noprogress & 1U) == 0) {
    newer = tvnow();
    time_left._2_8_ = newer.tv_sec;
    local_70 = newer.tv_usec;
    older.tv_usec = progress_meter::stamp.tv_usec;
    older.tv_sec = progress_meter::stamp.tv_sec;
    lVar6 = tvdiff(newer,older);
    if ((progress_meter::header & 1U) == 0) {
      progress_meter::header = true;
      fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd Total     Current  Left    Speed\n",
            (FILE *)global->errors);
    }
    if ((final) || (500 < lVar6)) {
      _ulpercen = tvdiff(newer,*start);
      _ulpercen = _ulpercen / 1000;
      per._4_4_ = 0x2d2d;
      per._0_4_ = 0x2d2d;
      bVar3 = true;
      bVar2 = true;
      all_queued = 0;
      speed = 0;
      progress_meter::stamp.tv_sec._0_1_ = time_left[2];
      progress_meter::stamp.tv_sec._1_1_ = time_left[3];
      progress_meter::stamp.tv_sec._2_1_ = time_left[4];
      progress_meter::stamp.tv_sec._3_1_ = time_left[5];
      progress_meter::stamp.tv_sec._4_1_ = time_left[6];
      progress_meter::stamp.tv_sec._5_1_ = time_left[7];
      progress_meter::stamp.tv_sec._6_1_ = time_left[8];
      progress_meter::stamp.tv_sec._7_1_ = time_left[9];
      progress_meter::stamp.tv_usec = local_70;
      all_ulnow = all_dlalready;
      cStack_d0 = all_ulalready;
      for (all_dlnow = (curl_off_t)transfers; all_dlnow != 0; all_dlnow = *(curl_off_t *)all_dlnow)
      {
        all_ulnow = *(long *)(all_dlnow + 0x290) + all_ulnow;
        cStack_d0 = *(long *)(all_dlnow + 0x2a0) + cStack_d0;
        if (*(long *)(all_dlnow + 0x288) == 0) {
          bVar3 = false;
        }
        else if ((*(byte *)(all_dlnow + 0x2a8) & 1) == 0) {
          all_dltotal = *(long *)(all_dlnow + 0x288) + all_dltotal;
          *(undefined1 *)(all_dlnow + 0x2a8) = 1;
        }
        if (*(long *)(all_dlnow + 0x298) == 0) {
          bVar2 = false;
        }
        else if ((*(byte *)(all_dlnow + 0x2a9) & 1) == 0) {
          all_ultotal = *(long *)(all_dlnow + 0x298) + all_ultotal;
          *(undefined1 *)(all_dlnow + 0x2a9) = 1;
        }
        if ((*(byte *)(all_dlnow + 0x279) & 1) == 0) {
          speed = speed + 1;
        }
        else {
          all_queued = all_queued + 1;
        }
      }
      if ((bVar3) && (all_dltotal != 0)) {
        curl_msnprintf((long)&per + 4,4,"%3ld",(all_ulnow * 100) / all_dltotal);
      }
      if ((bVar2) && (all_ultotal != 0)) {
        curl_msnprintf(&per,4,"%3ld",(cStack_d0 * 100) / all_ultotal);
      }
      uVar5 = speedindex;
      speedstore[speedindex].dl = all_ulnow;
      speedstore[uVar5].ul = cStack_d0;
      speedstore[uVar5].stamp.tv_sec = time_left._2_8_;
      speedstore[uVar5].stamp.tv_usec = local_70;
      speedindex = speedindex + 1;
      if (9 < speedindex) {
        indexwrapped = true;
        speedindex = 0;
      }
      if ((indexwrapped & 1U) == 0) {
        dl = tvdiff(newer,*start);
        ul = all_ulnow;
        dls = cStack_d0;
      }
      else {
        dl = tvdiff(newer,speedstore[speedindex].stamp);
        ul = all_ulnow - speedstore[speedindex].dl;
        dls = cStack_d0 - speedstore[speedindex].ul;
      }
      lVar6 = (long)((double)ul / ((double)dl / 1000.0));
      local_138 = (long)((double)dls / ((double)dl / 1000.0));
      if (local_138 < lVar6) {
        local_138 = lVar6;
      }
      if ((bVar3) && (local_138 != 0)) {
        lVar6 = all_dltotal / local_138;
        time2str(time_total + 2,(all_dltotal - all_ulnow) / local_138);
        time2str(time_spent + 2,lVar6);
      }
      else {
        time2str(time_total + 2,0);
        time2str(time_spent + 2,0);
      }
      time2str(buffer[1] + 4,_ulpercen);
      pFVar1 = global->errors;
      pcVar7 = max5data(all_ulnow,(char *)&spent);
      pcVar8 = max5data(cStack_d0,(char *)((long)&spent + 6));
      cVar4 = all_xfers;
      pcVar9 = max5data(local_138,buffer[0] + 4);
      pcVar10 = "";
      if (final) {
        pcVar10 = "\n";
      }
      curl_mfprintf(pFVar1,"\r%-3s %-3s %s %s %5ld %5ld %5ld %s %s %s %s %5s",(long)&per + 4,&per,
                    pcVar7,pcVar8,cVar4,all_queued,speed,time_spent + 2,buffer[1] + 4,time_total + 2
                    ,pcVar9,pcVar10);
      global_local._7_1_ = true;
    }
    else {
      global_local._7_1_ = false;
    }
  }
  else {
    global_local._7_1_ = false;
  }
  return global_local._7_1_;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct timeval *start,
                    bool final)
{
  static struct timeval stamp;
  static bool header = FALSE;
  struct timeval now;
  long diff;

  if(global->noprogress)
    return FALSE;

  now = tvnow();
  diff = tvdiff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd "
          "Total     Current  Left    Speed\n",
          global->errors);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = tvdiff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t all_queued = 0;  /* pending */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(!per->added)
        all_queued++;
      else
        all_running++;
    }
    if(dlknown && all_dltotal)
      /* TODO: handle integer overflow */
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow * 100 / all_dltotal);
    if(ulknown && all_ultotal)
      /* TODO: handle integer overflow */
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow * 100 / all_ultotal);

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      long deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = tvdiff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = tvdiff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(global->errors,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Queued */
            "%s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            all_queued,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}